

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

void render_memory_region
               (FlatView *view,MemoryRegion_conflict *mr,Int128 base,AddrRange clip,_Bool readonly)

{
  MemoryRegion *mr_00;
  FlatRange *pFVar1;
  AddrRange clip_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  long in_RCX;
  undefined7 in_register_00000011;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  byte in_R8B;
  long lVar13;
  hwaddr hVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  undefined8 in_stack_ffffffffffffff68;
  FlatRange local_78;
  
  if (mr->enabled == true) {
    uVar17 = CONCAT71(in_register_00000011,readonly) + mr->addr;
    lVar21 = in_RCX + (ulong)CARRY8(CONCAT71(in_register_00000011,readonly),mr->addr);
    auVar3._8_8_ = lVar21;
    auVar3._0_8_ = uVar17;
    bVar11 = in_R8B | mr->readonly;
    uVar9 = (ulong)mr->size;
    lVar20 = *(long *)((long)&mr->size + 8);
    if ((((SBORROW8(base._8_8_,lVar21) !=
          SBORROW8(base._8_8_ - lVar21,(ulong)((ulong)base < uVar17))) ==
          (long)((base._8_8_ - lVar21) - (ulong)((ulong)base < uVar17)) < 0) &&
        (lVar13 = lVar20 + lVar21 + (ulong)CARRY8(uVar9,uVar17),
        uVar10 = (ulong)((ulong)base < uVar9 + uVar17), lVar15 = base._8_8_ - lVar13,
        (SBORROW8(base._8_8_,lVar13) != SBORROW8(lVar15,uVar10)) != (long)(lVar15 - uVar10) < 0)) ||
       (((SBORROW8(lVar21,base._8_8_) != SBORROW8(lVar21 - base._8_8_,(ulong)(uVar17 < (ulong)base))
         ) == (long)((lVar21 - base._8_8_) - (ulong)(uVar17 < (ulong)base)) < 0 &&
        (auVar2 = (undefined1  [16])base + (undefined1  [16])clip.start, lVar13 = auVar2._8_8_,
        uVar10 = (ulong)(uVar17 < auVar2._0_8_), lVar15 = lVar21 - lVar13,
        (SBORROW8(lVar21,lVar13) != SBORROW8(lVar15,uVar10)) != (long)(lVar15 - uVar10) < 0)))) {
      auVar2 = (undefined1  [16])base;
      if ((SBORROW8(base._8_8_,lVar21) !=
          SBORROW8(base._8_8_ - lVar21,(ulong)((ulong)base < uVar17))) !=
          (long)((base._8_8_ - lVar21) - (ulong)((ulong)base < uVar17)) < 0) {
        auVar2 = auVar3;
      }
      lVar15 = lVar20 + lVar21 + (ulong)CARRY8(uVar9,uVar17);
      auVar5._8_8_ = lVar15;
      auVar5._0_8_ = uVar9 + uVar17;
      auVar4 = (undefined1  [16])base + (undefined1  [16])clip.start;
      uVar9 = (ulong)(uVar9 + uVar17 < auVar4._0_8_);
      lVar20 = lVar15 - auVar4._8_8_;
      if ((SBORROW8(lVar15,auVar4._8_8_) != SBORROW8(lVar20,uVar9)) != (long)(lVar20 - uVar9) < 0) {
        auVar4 = auVar5;
      }
      auVar4 = auVar4 - auVar2;
      for (mr_00 = (mr->subregions).tqh_first; mr_00 != (MemoryRegion *)0x0;
          mr_00 = (mr_00->subregions_link).tqe_next) {
        clip_00.size._0_8_ = in_stack_ffffffffffffff68;
        clip_00.start = (Int128)auVar4;
        clip_00.size._8_8_ = (MemoryRegion *)mr;
        render_memory_region
                  (view,(MemoryRegion_conflict *)mr_00,(Int128)auVar2,clip_00,SUB81(uVar17,0));
      }
      if (((MemoryRegion *)mr)->terminates == true) {
        hVar14 = auVar2._0_8_ - uVar17;
        if (auVar2._8_8_ - (ulong)(auVar2._0_8_ < uVar17) != lVar21) {
LAB_00cf8b07:
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        uVar12 = 0;
        local_78.mr = (MemoryRegion *)mr;
        local_78.readonly = (_Bool)bVar11;
        if ((auVar4._0_8_ != 0 || auVar4._8_8_ != 0) && view->nr != 0) {
          uVar9 = 0;
          do {
            lVar18 = auVar4._8_8_;
            uVar16 = auVar4._0_8_;
            lVar13 = auVar2._8_8_;
            uVar19 = auVar2._0_8_;
            pFVar1 = view->ranges;
            uVar12 = (uint)uVar9;
            uVar17 = (ulong)pFVar1[uVar9].addr.start;
            lVar20 = *(long *)((long)&pFVar1[uVar9].addr.start + 8);
            uVar10 = (ulong)pFVar1[uVar9].addr.size;
            lVar15 = *(long *)((long)&pFVar1[uVar9].addr.size + 8) + lVar20 +
                     (ulong)CARRY8(uVar10,uVar17);
            uVar10 = (ulong)(uVar19 < uVar10 + uVar17);
            lVar21 = lVar13 - lVar15;
            if ((SBORROW8(lVar13,lVar15) != SBORROW8(lVar21,uVar10)) != (long)(lVar21 - uVar10) < 0)
            {
              if ((SBORROW8(lVar13,lVar20) != SBORROW8(lVar13 - lVar20,(ulong)(uVar19 < uVar17))) !=
                  (long)((lVar13 - lVar20) - (ulong)(uVar19 < uVar17)) < 0) {
                lVar20 = (lVar20 - lVar13) - (ulong)(uVar17 < uVar19);
                local_78.addr.size._8_8_ = lVar20;
                local_78.addr.size._0_8_ = uVar17 - uVar19;
                uVar9 = (ulong)(uVar16 < uVar17 - uVar19);
                if ((SBORROW8(lVar18,lVar20) != SBORROW8(lVar18 - lVar20,uVar9)) !=
                    (long)((lVar18 - lVar20) - uVar9) < 0) {
                  local_78.addr.size = (Int128)auVar4;
                }
                lVar20 = SUB168(local_78.addr.size,8);
                uVar17 = (ulong)local_78.addr.size;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar17;
                local_78.offset_in_region = hVar14;
                local_78.addr.start = (Int128)auVar2;
                flatview_insert(view,uVar12,&local_78);
                if (lVar20 != 0) goto LAB_00cf8b07;
                auVar2 = auVar2 + auVar8;
                uVar9 = (ulong)(uVar12 + 1);
                hVar14 = hVar14 + uVar17;
                auVar4._8_8_ = lVar18 - (ulong)(uVar16 < uVar17);
                auVar4._0_8_ = uVar16 - uVar17;
              }
              uVar16 = auVar4._0_8_;
              auVar3 = auVar2 + auVar4;
              pFVar1 = view->ranges;
              uVar12 = (uint)uVar9;
              uVar17 = (ulong)pFVar1[uVar9].addr.size;
              uVar10 = uVar17 + (long)pFVar1[uVar9].addr.start;
              lVar21 = *(long *)((long)&pFVar1[uVar9].addr.size + 8) +
                       *(long *)((long)&pFVar1[uVar9].addr.start + 8) +
                       (ulong)CARRY8(uVar17,(ulong)pFVar1[uVar9].addr.start);
              auVar6._8_8_ = lVar21;
              auVar6._0_8_ = uVar10;
              uVar9 = (ulong)(auVar3._0_8_ < uVar10);
              lVar20 = auVar3._8_8_ - lVar21;
              if ((SBORROW8(auVar3._8_8_,lVar21) != SBORROW8(lVar20,uVar9)) ==
                  (long)(lVar20 - uVar9) < 0) {
                auVar3 = auVar6;
              }
              uVar9 = auVar3._0_8_ - auVar2._0_8_;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar9;
              if (auVar3._8_8_ - (ulong)(auVar3._0_8_ < auVar2._0_8_) != auVar2._8_8_)
              goto LAB_00cf8b07;
              auVar2 = auVar2 + auVar7;
              hVar14 = hVar14 + uVar9;
              auVar4._8_8_ = auVar4._8_8_ - (ulong)(uVar16 < uVar9);
              auVar4._0_8_ = uVar16 - uVar9;
            }
            uVar12 = uVar12 + 1;
            uVar9 = (ulong)uVar12;
          } while ((uVar12 < view->nr) && (auVar4._0_8_ != 0 || auVar4._8_8_ != 0));
        }
        if (auVar4._0_8_ != 0 || auVar4._8_8_ != 0) {
          local_78.offset_in_region = hVar14;
          local_78.addr.start = (Int128)auVar2;
          local_78.addr.size = (Int128)auVar4;
          flatview_insert(view,uVar12,&local_78);
        }
      }
    }
  }
  return;
}

Assistant:

static void render_memory_region(FlatView *view,
                                 MemoryRegion *mr,
                                 Int128 base,
                                 AddrRange clip,
                                 bool readonly)
{
    MemoryRegion *subregion;
    unsigned i;
    hwaddr offset_in_region;
    Int128 remain;
    Int128 now;
    FlatRange fr;
    AddrRange tmp;

    if (!mr->enabled) {
        return;
    }

    int128_addto(&base, int128_make64(mr->addr));
    readonly |= mr->readonly;

    tmp = addrrange_make(base, mr->size);

    if (!addrrange_intersects(tmp, clip)) {
        return;
    }

    clip = addrrange_intersection(tmp, clip);

    /* Render subregions in priority order. */
    QTAILQ_FOREACH(subregion, &mr->subregions, subregions_link) {
        render_memory_region(view, subregion, base, clip, readonly);
    }

    if (!mr->terminates) {
        return;
    }

    offset_in_region = int128_get64(int128_sub(clip.start, base));
    base = clip.start;
    remain = clip.size;

    fr.mr = mr;
    fr.readonly = readonly;

    /* Render the region itself into any gaps left by the current view. */
    for (i = 0; i < view->nr && int128_nz(remain); ++i) {
        if (int128_ge(base, addrrange_end(view->ranges[i].addr))) {
            continue;
        }
        if (int128_lt(base, view->ranges[i].addr.start)) {
            now = int128_min(remain,
                             int128_sub(view->ranges[i].addr.start, base));
            fr.offset_in_region = offset_in_region;
            fr.addr = addrrange_make(base, now);
            flatview_insert(view, i, &fr);
            ++i;
            int128_addto(&base, now);
            offset_in_region += int128_get64(now);
            int128_subfrom(&remain, now);
        }
        now = int128_sub(int128_min(int128_add(base, remain),
                                    addrrange_end(view->ranges[i].addr)),
                         base);
        int128_addto(&base, now);
        offset_in_region += int128_get64(now);
        int128_subfrom(&remain, now);
    }
    if (int128_nz(remain)) {
        fr.offset_in_region = offset_in_region;
        fr.addr = addrrange_make(base, remain);
        flatview_insert(view, i, &fr);
    }
}